

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

DatabaseInterface *
Fossilize::create_concurrent_database_with_encoded_extra_paths
          (char *base_path,DatabaseMode mode,char *encoded_extra_paths)

{
  _Alloc_hider extra_paths;
  size_t sVar1;
  ConcurrentDatabase *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  pointer pbVar2;
  long lVar3;
  vector<const_char_*,_std::allocator<const_char_*>_> char_paths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  string local_78;
  char *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if (encoded_extra_paths == (char *)0x0) {
    this = (ConcurrentDatabase *)operator_new(0x2d8);
    ConcurrentDatabase::ConcurrentDatabase(this,base_path,mode,(char **)0x0,0);
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    sVar1 = strlen(encoded_extra_paths);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,encoded_extra_paths,encoded_extra_paths + sVar1);
    Path::split_no_empty(&local_48,&local_78,";:");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    local_78.field_2._M_allocated_capacity = 0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_78,
               (long)local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar2 = local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_50 = (pbVar2->_M_dataplus)._M_p;
        if (local_78._M_string_length == local_78.field_2._M_allocated_capacity) {
          std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                    ((vector<char_const*,std::allocator<char_const*>> *)&local_78,
                     (iterator)local_78._M_string_length,&local_50);
        }
        else {
          *(char **)local_78._M_string_length = local_50;
          local_78._M_string_length = local_78._M_string_length + 8;
        }
        pbVar2 = pbVar2 + 1;
      } while (pbVar2 != local_48.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    extra_paths._M_p = local_78._M_dataplus._M_p;
    lVar3 = local_78._M_string_length - (long)local_78._M_dataplus._M_p;
    this = (ConcurrentDatabase *)operator_new(0x2d8);
    ConcurrentDatabase::ConcurrentDatabase(this,base_path,mode,(char **)extra_paths._M_p,lVar3 >> 3)
    ;
    if ((char **)local_78._M_dataplus._M_p != (char **)0x0) {
      operator_delete(local_78._M_dataplus._M_p,
                      local_78.field_2._M_allocated_capacity - (long)local_78._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  }
  return &this->super_DatabaseInterface;
}

Assistant:

DatabaseInterface *create_concurrent_database_with_encoded_extra_paths(const char *base_path, DatabaseMode mode,
                                                                       const char *encoded_extra_paths)
{
	if (!encoded_extra_paths)
		return create_concurrent_database(base_path, mode, nullptr, 0);

#ifdef _WIN32
	auto paths = Path::split_no_empty(encoded_extra_paths, ";");
#else
	auto paths = Path::split_no_empty(encoded_extra_paths, ";:");
#endif

	std::vector<const char *> char_paths;
	char_paths.reserve(paths.size());
	for (auto &path : paths)
		char_paths.push_back(path.c_str());

	return create_concurrent_database(base_path, mode, char_paths.data(), char_paths.size());
}